

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O1

__pid_t __thiscall QThreadPrivate::wait(QThreadPrivate *this,void *__stat_loc)

{
  byte *pbVar1;
  __pointer_type copy;
  QBasicMutex *this_00;
  __pid_t _Var2;
  int iVar3;
  ulong uVar4;
  undefined8 extraout_RAX;
  void *in_RCX;
  QThreadPrivate *in_RDX;
  undefined1 **ppuVar5;
  long in_FS_OFFSET;
  bool bVar6;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  long local_38;
  
  ppuVar5 = &local_68;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RDX == (QThreadPrivate *)0x7fffffffffffffff) {
    ppuVar5 = (undefined1 **)(undefined1 *)0x0;
  }
  else {
    local_58._0_8_ = in_RDX;
    local_58._8_8_ = in_RCX;
    uVar4 = QDeadlineTimer::deadlineNSecs((QDeadlineTimer *)local_58);
    if ((long)uVar4 < 0) {
      local_68 = (undefined1 *)0x0;
      puStack_60 = (undefined1 *)0x0;
    }
    else {
      local_68 = (undefined1 *)(uVar4 / 1000000000);
      puStack_60 = (undefined1 *)(uVar4 % 1000000000);
      ppuVar5 = &local_68;
    }
  }
  iVar3 = this->waiters;
  this->waiters = iVar3 + 1;
  bVar6 = -2 < iVar3;
  while ((!bVar6 || (this->data->isAdopted != false))) {
    _Var2 = QWaitCondition::wait(&this->thread_done,*__stat_loc);
    if ((char)_Var2 == '\0') {
      _Var2 = 0;
      goto LAB_003cd6d2;
    }
    bVar6 = this->threadState == Finished;
    _Var2 = CONCAT31((int3)((uint)_Var2 >> 8),bVar6);
    if (bVar6) goto LAB_003cd6d2;
    bVar6 = -1 < this->waiters;
  }
  local_48 = 0x6e;
  uStack_44 = 0xaaaaaaaa;
  pbVar1 = (byte *)((long)&this->waiters + 3);
  *pbVar1 = *pbVar1 | 0x80;
  this_00 = *__stat_loc;
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  local_58._0_8_ = this;
  local_58._8_8_ = __stat_loc;
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,copy);
  }
  *(undefined1 *)((long)__stat_loc + 8) = 0;
  iVar3 = pthread_clockjoin_np
                    ((this->data->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p,0,1,
                     ppuVar5);
  _local_48 = CONCAT44(uStack_44,iVar3);
  anon_func::CancelState::run(local_58);
  _Var2 = (__pid_t)CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar3 != 0x6e);
LAB_003cd6d2:
  this->waiters = this->waiters + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return _Var2;
}

Assistant:

bool QThreadPrivate::wait(QMutexLocker<QMutex> &locker, QDeadlineTimer deadline)
{
    constexpr int HasJoinerBit = int(0x8000'0000);  // a.k.a. sign bit
    struct timespec ts, *pts = nullptr;
    if (!deadline.isForever()) {
        ts = deadlineToAbstime(deadline);
        pts = &ts;
    }

    auto doJoin = [&] {
        // pthread_join() & family are cancellation points
        struct CancelState {
            QThreadPrivate *d;
            QMutexLocker<QMutex> *locker;
            int joinResult = ETIMEDOUT;
            static void run(void *arg) { static_cast<CancelState *>(arg)->run(); }
            void run()
            {
                locker->relock();
                if (joinResult == ETIMEDOUT && d->waiters)
                    d->thread_done.wakeOne();
                else if (joinResult == 0)
                    wakeAllInternal(d);
                d->waiters &= ~HasJoinerBit;
            }
        } nocancel = { this, &locker };
        int &r = nocancel.joinResult;

        // we're going to perform the join, so don't let other threads do it
        waiters |= HasJoinerBit;
        locker.unlock();

        pthread_cleanup_push(&CancelState::run, &nocancel);
        pthread_t thrId = from_HANDLE<pthread_t>(data->threadId.loadRelaxed());
        if constexpr (QT_CONFIG(pthread_clockjoin))
            r = pthread_clockjoin_np(thrId, nullptr, SteadyClockClockId, pts);
        else
            r = pthread_timedjoin_np(thrId, nullptr, pts);
        Q_ASSERT(r == 0 || r == ETIMEDOUT);
        pthread_cleanup_pop(1);

        Q_ASSERT(waiters >= 0);
        return r != ETIMEDOUT;
    };
    Q_ASSERT(threadState != QThreadPrivate::Finished);
    Q_ASSERT(locker.isLocked());

    bool result = false;

    // both branches call cancellation points
    ++waiters;
    bool mustJoin = (waiters & HasJoinerBit) == 0;
    pthread_cleanup_push([](void *ptr) {
        --(*static_cast<decltype(waiters) *>(ptr));
    }, &waiters);
    for (;;) {
        if (UsingPThreadTimedJoin && mustJoin && !data->isAdopted) {
            result = doJoin();
            break;
        }
        if (!thread_done.wait(locker.mutex(), deadline))
            break;      // timed out
        result = threadState == QThreadPrivate::Finished;
        if (result)
            break;      // success
        mustJoin = (waiters & HasJoinerBit) == 0;
    }
    pthread_cleanup_pop(1);

    return result;
}